

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tests.cpp
# Opt level: O0

void __thiscall
MatrixTests_ChainedOperations_Test::TestBody(MatrixTests_ChainedOperations_Test *this)

{
  bool bVar1;
  iterator pvVar2;
  iterator pvVar3;
  size_type sVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  AssertHelper local_4a0;
  Message local_498;
  double local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_3;
  double sum4;
  expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:247:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>,_mcc::matrix<double,_3UL,_3UL>_>
  local_458;
  undefined1 local_440 [8];
  matrix res4;
  Message local_3d8;
  double local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_2;
  double sum3;
  expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_double>
  local_3a8;
  expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_double>,_mcc::matrix<double,_3UL,_3UL>_>
  local_390;
  expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_double>,_mcc::matrix<double,_3UL,_3UL>_>,_mcc::matrix<double,_3UL,_3UL>_>
  local_378;
  undefined1 local_360 [8];
  matrix res3;
  Message local_2f8;
  double local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_1;
  double sum2;
  expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>
  local_2c8;
  expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>,_mcc::matrix<double,_3UL,_3UL>_>
  local_2b0;
  expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>,_mcc::matrix<double,_3UL,_3UL>_>,_double>
  local_298;
  undefined1 local_280 [8];
  matrix res2;
  AssertHelper local_218;
  Message local_210 [3];
  double local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  double sum;
  expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>,_mcc::matrix<double,_3UL,_3UL>_>
  local_1c0;
  undefined1 local_1a8 [8];
  matrix res1;
  undefined1 local_140 [8];
  matrix third;
  undefined1 local_d8 [8];
  matrix second;
  undefined1 local_70 [8];
  matrix first;
  MatrixTests_ChainedOperations_Test *this_local;
  
  second.data_._M_elems[8] = 1.0;
  first.data_._M_elems[8] = (double)this;
  mcc::matrix<double,_3UL,_3UL>::matrix
            ((matrix<double,_3UL,_3UL> *)local_70,second.data_._M_elems + 8);
  third.data_._M_elems[8] = 2.0;
  mcc::matrix<double,_3UL,_3UL>::matrix
            ((matrix<double,_3UL,_3UL> *)local_d8,third.data_._M_elems + 8);
  res1.data_._M_elems[8] = 3.0;
  mcc::matrix<double,_3UL,_3UL>::matrix
            ((matrix<double,_3UL,_3UL> *)local_140,res1.data_._M_elems + 8);
  mcc::operator+((expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>
                  *)&sum,(matrix<double,_3UL,_3UL> *)local_70,(matrix<double,_3UL,_3UL> *)local_d8);
  mcc::operator+(&local_1c0,
                 (expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>
                  *)&sum,(matrix<double,_3UL,_3UL> *)local_140);
  mcc::matrix<double,_3UL,_3UL>::
  matrix<mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>,_mcc::matrix<double,_3UL,_3UL>_>_>
            ((matrix<double,_3UL,_3UL> *)local_1a8,&local_1c0);
  pvVar2 = mcc::matrix<double,_3UL,_3UL>::begin((matrix<double,_3UL,_3UL> *)local_1a8);
  pvVar3 = mcc::matrix<double,_3UL,_3UL>::end((matrix<double,_3UL,_3UL> *)local_1a8);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::accumulate<double*,double>(pvVar2,pvVar3,0.0);
  sVar4 = mcc::matrix<double,_3UL,_3UL>::size((matrix<double,_3UL,_3UL> *)local_1a8);
  auVar6._8_4_ = (int)(sVar4 >> 0x20);
  auVar6._0_8_ = sVar4;
  auVar6._12_4_ = 0x45300000;
  local_1f8 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 6.0;
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_1f0,"sum","(1.0 + 2.0 + 3.0) * res1.size()",
             (double *)&gtest_ar.message_,&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(local_210);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/matrix_tests.cpp"
               ,0x5b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_218,local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::Message::~Message(local_210);
  }
  res2.data_._M_elems[8]._5_3_ = 0;
  res2.data_._M_elems[8]._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  if (res2.data_._M_elems[8]._4_4_ == 0) {
    mcc::operator+(&local_2c8,(matrix<double,_3UL,_3UL> *)local_70,
                   (matrix<double,_3UL,_3UL> *)local_d8);
    mcc::operator+(&local_2b0,&local_2c8,(matrix<double,_3UL,_3UL> *)local_140);
    sum2 = 6.0;
    mcc::
    operator+<mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>,_mcc::matrix<double,_3UL,_3UL>_>,_double>
              (&local_298,&local_2b0,&sum2);
    mcc::matrix<double,_3UL,_3UL>::
    matrix<mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>,_mcc::matrix<double,_3UL,_3UL>_>,_double>_>
              ((matrix<double,_3UL,_3UL> *)local_280,&local_298);
    pvVar2 = mcc::matrix<double,_3UL,_3UL>::begin((matrix<double,_3UL,_3UL> *)local_280);
    pvVar3 = mcc::matrix<double,_3UL,_3UL>::end((matrix<double,_3UL,_3UL> *)local_280);
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::accumulate<double*,double>(pvVar2,pvVar3,0.0);
    sVar4 = mcc::matrix<double,_3UL,_3UL>::size((matrix<double,_3UL,_3UL> *)local_280);
    auVar7._8_4_ = (int)(sVar4 >> 0x20);
    auVar7._0_8_ = sVar4;
    auVar7._12_4_ = 0x45300000;
    local_2f0 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 12.0;
    testing::internal::EqHelper<false>::Compare<double,double>
              ((EqHelper<false> *)local_2e8,"sum2","(1.0 + 2.0 + 3.0 + 6.0) * res2.size()",
               (double *)&gtest_ar_1.message_,&local_2f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
    if (!bVar1) {
      testing::Message::Message(&local_2f8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(res3.data_._M_elems + 8),kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/matrix_tests.cpp"
                 ,0x5f,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(res3.data_._M_elems + 8),&local_2f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(res3.data_._M_elems + 8));
      testing::Message::~Message(&local_2f8);
    }
    res2.data_._M_elems[8]._5_3_ = 0;
    res2.data_._M_elems[8]._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
    if (res2.data_._M_elems[8]._4_4_ == 0) {
      sum3 = 10.0;
      mcc::operator+(&local_3a8,(matrix<double,_3UL,_3UL> *)local_70,&sum3);
      mcc::operator+(&local_390,&local_3a8,(matrix<double,_3UL,_3UL> *)local_d8);
      mcc::
      operator+<mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_double>,_mcc::matrix<double,_3UL,_3UL>_>,_mcc::matrix<double,_3UL,_3UL>_>
                (&local_378,&local_390,(matrix<double,_3UL,_3UL> *)local_140);
      mcc::matrix<double,_3UL,_3UL>::
      matrix<mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_double>,_mcc::matrix<double,_3UL,_3UL>_>,_mcc::matrix<double,_3UL,_3UL>_>_>
                ((matrix<double,_3UL,_3UL> *)local_360,&local_378);
      pvVar2 = mcc::matrix<double,_3UL,_3UL>::begin((matrix<double,_3UL,_3UL> *)local_360);
      pvVar3 = mcc::matrix<double,_3UL,_3UL>::end((matrix<double,_3UL,_3UL> *)local_360);
      gtest_ar_2.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::accumulate<double*,double>(pvVar2,pvVar3,0.0);
      sVar4 = mcc::matrix<double,_3UL,_3UL>::size((matrix<double,_3UL,_3UL> *)local_360);
      auVar8._8_4_ = (int)(sVar4 >> 0x20);
      auVar8._0_8_ = sVar4;
      auVar8._12_4_ = 0x45300000;
      local_3d0 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 16.0;
      testing::internal::EqHelper<false>::Compare<double,double>
                ((EqHelper<false> *)local_3c8,"sum3","(1.0 + 10.0 + 2.0 + 3.0) * res3.size()",
                 (double *)&gtest_ar_2.message_,&local_3d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
      if (!bVar1) {
        testing::Message::Message(&local_3d8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(res4.data_._M_elems + 8),kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/matrix_tests.cpp"
                   ,99,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)(res4.data_._M_elems + 8),&local_3d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(res4.data_._M_elems + 8));
        testing::Message::~Message(&local_3d8);
      }
      res2.data_._M_elems[8]._5_3_ = 0;
      res2.data_._M_elems[8]._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
      if (res2.data_._M_elems[8]._4_4_ == 0) {
        mcc::operator+((expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>
                        *)&sum4,(matrix<double,_3UL,_3UL> *)local_70,
                       (matrix<double,_3UL,_3UL> *)local_d8);
        mcc::operator+(&local_458,
                       (expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>
                        *)&sum4,(matrix<double,_3UL,_3UL> *)local_140);
        mcc::matrix<double,_3UL,_3UL>::
        matrix<mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:247:4),_mcc::expression<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DeveloperPaul123[P]modern_cpp_challenge_language_features_include_matrix_h:238:4),_mcc::matrix<double,_3UL,_3UL>,_mcc::matrix<double,_3UL,_3UL>_>,_mcc::matrix<double,_3UL,_3UL>_>_>
                  ((matrix<double,_3UL,_3UL> *)local_440,&local_458);
        pvVar2 = mcc::matrix<double,_3UL,_3UL>::begin((matrix<double,_3UL,_3UL> *)local_440);
        pvVar3 = mcc::matrix<double,_3UL,_3UL>::end((matrix<double,_3UL,_3UL> *)local_440);
        gtest_ar_3.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::accumulate<double*,double>(pvVar2,pvVar3,0.0);
        local_490 = 0.0;
        testing::internal::EqHelper<false>::Compare<double,double>
                  ((EqHelper<false> *)local_488,"sum4","0.0",(double *)&gtest_ar_3.message_,
                   &local_490);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
        if (!bVar1) {
          testing::Message::Message(&local_498);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/matrix_tests.cpp"
                     ,0x67,pcVar5);
          testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
          testing::internal::AssertHelper::~AssertHelper(&local_4a0);
          testing::Message::~Message(&local_498);
        }
        res2.data_._M_elems[8]._5_3_ = 0;
        res2.data_._M_elems[8]._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
      }
    }
  }
  return;
}

Assistant:

TEST(MatrixTests, ChainedOperations)
{
	using matrix = mcc::matrix<double, 3, 3>;
	matrix first(1.0);
	matrix second(2.0);
	matrix third(3.0);

	matrix res1 = first + second + third;
	const auto sum = std::accumulate(res1.begin(), res1.end(), 0.0);
	ASSERT_EQ(sum, (1.0 + 2.0 + 3.0) * res1.size());

	matrix res2 = first + second + third + 6.0;
	const auto sum2 = std::accumulate(res2.begin(), res2.end(), 0.0);
	ASSERT_EQ(sum2, (1.0 + 2.0 + 3.0 + 6.0) * res2.size());

	matrix res3 = first + 10.0 + second + third;
	const auto sum3 = std::accumulate(res3.begin(), res3.end(), 0.0);
	ASSERT_EQ(sum3, (1.0 + 10.0 + 2.0 + 3.0) * res3.size());

	matrix res4 = (first + second) - third;
	const auto sum4 = std::accumulate(res4.begin(), res4.end(), 0.0);
	ASSERT_EQ(sum4, 0.0);
}